

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_build_parser.cpp
# Opt level: O0

void Omega_h::deal_with_tests_failed
               (int *num_originators_failed,int *first_originator_failed,int zeta_prime_addr,
               bool *tests_failed,vector<int,_std::allocator<int>_> *lane,
               vector<bool,_std::allocator<bool>_> *in_lane,int zeta_addr,
               vector<int,_std::allocator<int>_> *stack,bool verbose)

{
  vector<bool,_std::allocator<bool>_> *pvVar1;
  int iVar2;
  ostream *poVar3;
  reference pvVar4;
  size_type sVar5;
  value_type_conflict1 local_5c [2];
  int local_54;
  undefined1 auStack_50 [4];
  int zeta_double_prime_addr;
  byte local_39;
  vector<bool,_std::allocator<bool>_> *pvStack_38;
  bool verbose_local;
  vector<bool,_std::allocator<bool>_> *in_lane_local;
  vector<int,_std::allocator<int>_> *lane_local;
  bool *tests_failed_local;
  int *piStack_18;
  int zeta_prime_addr_local;
  int *first_originator_failed_local;
  int *num_originators_failed_local;
  
  local_39 = verbose;
  pvStack_38 = in_lane;
  in_lane_local = (vector<bool,_std::allocator<bool>_> *)lane;
  lane_local = (vector<int,_std::allocator<int>_> *)tests_failed;
  tests_failed_local._4_4_ = zeta_prime_addr;
  piStack_18 = first_originator_failed;
  first_originator_failed_local = num_originators_failed;
  if (verbose) {
    std::operator<<((ostream *)&std::cerr,"  Dealing with test failures\n");
  }
  if (*first_originator_failed_local == 0) {
    if ((local_39 & 1) != 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"    ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,tests_failed_local._4_4_);
      poVar3 = std::operator<<(poVar3," is the first originator of ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,zeta_addr);
      std::operator<<(poVar3," to fail the tests\n");
    }
    *piStack_18 = tests_failed_local._4_4_;
    if ((local_39 & 1) != 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"    pushing ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,tests_failed_local._4_4_);
      std::operator<<(poVar3," onto LANE:\n    ");
    }
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_lane_local,
               (value_type_conflict1 *)((long)&tests_failed_local + 4));
    if ((local_39 & 1) != 0) {
      print_stack((vector<int,_std::allocator<int>_> *)in_lane_local);
    }
    _auStack_50 = at<bool>(pvStack_38,tests_failed_local._4_4_);
    std::_Bit_reference::operator=((_Bit_reference *)auStack_50,true);
    if ((local_39 & 1) != 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"    IN_LANE(");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,tests_failed_local._4_4_);
      std::operator<<(poVar3,") <- ON\n");
    }
    *(undefined1 *)
     &(lane_local->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start = 1;
    if ((local_39 & 1) != 0) {
      std::operator<<((ostream *)&std::cerr,"    TESTS_FAILED <- ON\n");
    }
  }
  else if (*first_originator_failed_local == 1) {
    if ((local_39 & 1) != 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"    ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,tests_failed_local._4_4_);
      poVar3 = std::operator<<(poVar3," is the second originator of ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,zeta_addr);
      std::operator<<(poVar3," to fail the tests\n");
    }
    local_54 = *piStack_18;
    if ((local_39 & 1) != 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"    the first was ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_54);
      std::operator<<(poVar3,'\n');
    }
    pvVar1 = in_lane_local;
    iVar2 = size<int>((vector<int,_std::allocator<int>_> *)in_lane_local);
    pvVar4 = at<int>((vector<int,_std::allocator<int>_> *)pvVar1,iVar2 + -1);
    pvVar1 = in_lane_local;
    if (*pvVar4 != local_54) {
      fail("assertion %s failed at %s +%d\n","at(lane, size(lane) - 1) == zeta_double_prime_addr",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_build_parser.cpp"
           ,0x2c6);
    }
    iVar2 = size<int>((vector<int,_std::allocator<int>_> *)in_lane_local);
    pvVar4 = at<int>((vector<int,_std::allocator<int>_> *)pvVar1,iVar2 + -2);
    if (*pvVar4 != zeta_addr) {
      fail("assertion %s failed at %s +%d\n","at(lane, size(lane) - 2) == zeta_addr",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_build_parser.cpp"
           ,0x2c7);
    }
    if ((local_39 & 1) != 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"    pop LANE, push {marker, ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_54);
      std::operator<<(poVar3,"} onto it:\n    ");
    }
    pvVar1 = in_lane_local;
    sVar5 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)in_lane_local);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)pvVar1,sVar5 - 1);
    local_5c[1] = 0xfffffe4f;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_lane_local,local_5c + 1);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_lane_local,&local_54);
    if ((local_39 & 1) != 0) {
      print_stack((vector<int,_std::allocator<int>_> *)in_lane_local);
    }
    if ((local_39 & 1) != 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"    push {marker, ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,tests_failed_local._4_4_);
      std::operator<<(poVar3,"} onto STACK:\n    ");
    }
    local_5c[0] = -0x1b1;
    std::vector<int,_std::allocator<int>_>::push_back(stack,local_5c);
    std::vector<int,_std::allocator<int>_>::push_back
              (stack,(value_type_conflict1 *)((long)&tests_failed_local + 4));
    if ((local_39 & 1) != 0) {
      print_stack(stack);
    }
  }
  else {
    if ((local_39 & 1) != 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"    ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,tests_failed_local._4_4_);
      poVar3 = std::operator<<(poVar3," is the third or later originator of ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,zeta_addr);
      std::operator<<(poVar3," to fail the tests\n");
    }
    if ((local_39 & 1) != 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"    pushing ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,tests_failed_local._4_4_);
      std::operator<<(poVar3," onto STACK:\n    ");
    }
    std::vector<int,_std::allocator<int>_>::push_back
              (stack,(value_type_conflict1 *)((long)&tests_failed_local + 4));
    if ((local_39 & 1) != 0) {
      print_stack(stack);
    }
  }
  *first_originator_failed_local = *first_originator_failed_local + 1;
  return;
}

Assistant:

static void deal_with_tests_failed(int& num_originators_failed,
    int& first_originator_failed, int zeta_prime_addr, bool& tests_failed,
    std::vector<int>& lane, std::vector<bool>& in_lane, int zeta_addr,
    std::vector<int>& stack, bool verbose) {
  if (verbose) std::cerr << "  Dealing with test failures\n";
  if (num_originators_failed == 0) {
    if (verbose)
      std::cerr << "    " << zeta_prime_addr << " is the first originator of "
                << zeta_addr << " to fail the tests\n";
    first_originator_failed = zeta_prime_addr;
    if (verbose)
      std::cerr << "    pushing " << zeta_prime_addr << " onto LANE:\n    ";
    lane.push_back(zeta_prime_addr);
    if (verbose) print_stack(lane);
    at(in_lane, zeta_prime_addr) = true;
    if (verbose) std::cerr << "    IN_LANE(" << zeta_prime_addr << ") <- ON\n";
    tests_failed = true;
    if (verbose) std::cerr << "    TESTS_FAILED <- ON\n";
  } else if (num_originators_failed == 1) {
    if (verbose)
      std::cerr << "    " << zeta_prime_addr << " is the second originator of "
                << zeta_addr << " to fail the tests\n";
    auto zeta_double_prime_addr = first_originator_failed;
    if (verbose)
      std::cerr << "    the first was " << zeta_double_prime_addr << '\n';
    OMEGA_H_CHECK(at(lane, size(lane) - 1) == zeta_double_prime_addr);
    OMEGA_H_CHECK(at(lane, size(lane) - 2) == zeta_addr);
    if (verbose)
      std::cerr << "    pop LANE, push {marker, " << zeta_double_prime_addr
                << "} onto it:\n    ";
    lane.resize(lane.size() - 1);
    lane.push_back(MARKER);
    lane.push_back(zeta_double_prime_addr);
    if (verbose) print_stack(lane);
    if (verbose)
      std::cerr << "    push {marker, " << zeta_prime_addr
                << "} onto STACK:\n    ";
    stack.push_back(MARKER);
    stack.push_back(zeta_prime_addr);
    if (verbose) print_stack(stack);
  } else {
    if (verbose)
      std::cerr << "    " << zeta_prime_addr
                << " is the third or later originator of " << zeta_addr
                << " to fail the tests\n";
    if (verbose)
      std::cerr << "    pushing " << zeta_prime_addr << " onto STACK:\n    ";
    stack.push_back(zeta_prime_addr);
    if (verbose) print_stack(stack);
  }
  ++num_originators_failed;
}